

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * tinyfd_selectFolderDialog(char *aTitle,char *aDefaultPath)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  int lWasXterm;
  int lWasGraphicDialog;
  char *p;
  FILE *lIn;
  char lDialogString [1024];
  char *aDefaultPath_local;
  char *aTitle_local;
  
  bVar1 = false;
  bVar2 = false;
  tinyfd_selectFolderDialog::lBuff[0] = '\0';
  iVar3 = osascriptPresent();
  if (iVar3 == 0) {
    iVar3 = kdialogPresent();
    if (iVar3 == 0) {
      iVar3 = zenityPresent();
      if ((((iVar3 == 0) && (iVar3 = matedialogPresent(), iVar3 == 0)) &&
          (iVar3 = shellementaryPresent(), iVar3 == 0)) && (iVar3 = qarmaPresent(), iVar3 == 0)) {
        iVar3 = xdialogPresent();
        if ((iVar3 == 0) && (iVar3 = tkinter2Present(), iVar3 != 0)) {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            strcpy(tinyfd_response,"python2-tkinter");
            return (char *)0x1;
          }
          strcpy((char *)&lIn,gPython2Name);
          iVar3 = isTerminalRunning();
          if ((iVar3 == 0) && (iVar3 = isDarwin(), iVar3 != 0)) {
            strcat((char *)&lIn," -i");
          }
          strcat((char *)&lIn,
                 " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();");
          iVar3 = isDarwin();
          if (iVar3 != 0) {
            strcat((char *)&lIn,
                   "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                  );
          }
          strcat((char *)&lIn,"print tkFileDialog.askdirectory(");
          if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
            strcat((char *)&lIn,"title=\'");
            strcat((char *)&lIn,aTitle);
            strcat((char *)&lIn,"\',");
          }
          if ((aDefaultPath != (char *)0x0) && (sVar4 = strlen(aDefaultPath), sVar4 != 0)) {
            strcat((char *)&lIn,"initialdir=\'");
            strcat((char *)&lIn,aDefaultPath);
            strcat((char *)&lIn,"\'");
          }
          strcat((char *)&lIn,")\"");
        }
        else {
          iVar3 = xdialogPresent();
          if ((iVar3 == 0) && (iVar3 = tkinter3Present(), iVar3 != 0)) {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              strcpy(tinyfd_response,"python3-tkinter");
              return (char *)0x1;
            }
            strcpy((char *)&lIn,gPython3Name);
            strcat((char *)&lIn,
                   " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                  );
            strcat((char *)&lIn,"print( filedialog.askdirectory(");
            if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
              strcat((char *)&lIn,"title=\'");
              strcat((char *)&lIn,aTitle);
              strcat((char *)&lIn,"\',");
            }
            if ((aDefaultPath != (char *)0x0) && (sVar4 = strlen(aDefaultPath), sVar4 != 0)) {
              strcat((char *)&lIn,"initialdir=\'");
              strcat((char *)&lIn,aDefaultPath);
              strcat((char *)&lIn,"\'");
            }
            strcat((char *)&lIn,") )\"");
          }
          else {
            iVar3 = xdialogPresent();
            if ((iVar3 == 0) && (pcVar5 = dialogName(), pcVar5 == (char *)0x0)) {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                pcVar5 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                return pcVar5;
              }
              pcVar5 = tinyfd_inputBox(aTitle,"Select folder","");
              if (((pcVar5 != (char *)0x0) && (sVar4 = strlen(pcVar5), sVar4 != 0)) &&
                 (iVar3 = dirExists(pcVar5), iVar3 != 0)) {
                return pcVar5;
              }
              return (char *)0x0;
            }
            iVar3 = xdialogPresent();
            if (iVar3 == 0) {
              iVar3 = isTerminalRunning();
              if (iVar3 == 0) {
                if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0))
                {
                  strcpy(tinyfd_response,"dialog");
                  return (char *)0x0;
                }
                bVar2 = true;
                pcVar5 = terminalName();
                strcpy((char *)&lIn,pcVar5);
                strcat((char *)&lIn,"\'(");
                pcVar5 = dialogName();
                strcat((char *)&lIn,pcVar5);
                strcat((char *)&lIn," ");
              }
              else {
                if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0))
                {
                  strcpy(tinyfd_response,"dialog");
                  return (char *)0x0;
                }
                strcpy((char *)&lIn,"(dialog ");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                strcpy(tinyfd_response,"xdialog");
                return (char *)0x1;
              }
              bVar1 = true;
              strcpy((char *)&lIn,"(Xdialog ");
            }
            if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
              strcat((char *)&lIn,"--title \"");
              strcat((char *)&lIn,aTitle);
              strcat((char *)&lIn,"\" ");
            }
            iVar3 = xdialogPresent();
            if ((iVar3 == 0) && (iVar3 = gdialogPresent(), iVar3 == 0)) {
              strcat((char *)&lIn,"--backtitle \"");
              strcat((char *)&lIn,
                     "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY");
              strcat((char *)&lIn,"\" ");
            }
            strcat((char *)&lIn,"--dselect \"");
            if ((aDefaultPath == (char *)0x0) || (sVar4 = strlen(aDefaultPath), sVar4 == 0)) {
              iVar3 = isTerminalRunning();
              if ((iVar3 != 0) || (bVar1)) {
                strcat((char *)&lIn,"./");
              }
              else {
                pcVar5 = getenv("HOME");
                strcat((char *)&lIn,pcVar5);
                strcat((char *)&lIn,"/");
              }
            }
            else {
              strcat((char *)&lIn,aDefaultPath);
              ensureFinalSlash((char *)&lIn);
            }
            if (bVar1) {
              strcat((char *)&lIn,"\" 0 60 ) 2>&1 ");
            }
            else {
              strcat((char *)&lIn,"\" 0 60  >/dev/tty) ");
              if (bVar2) {
                strcat((char *)&lIn,"2>/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt");
              }
              else {
                strcat((char *)&lIn,"2>&1 ; clear >/dev/tty");
              }
            }
          }
        }
      }
      else {
        iVar3 = zenityPresent();
        if (iVar3 == 0) {
          iVar3 = matedialogPresent();
          if (iVar3 == 0) {
            iVar3 = shellementaryPresent();
            if (iVar3 == 0) {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                strcpy(tinyfd_response,"qarma");
                return (char *)0x1;
              }
              strcpy((char *)&lIn,"qarma");
              pcVar5 = getenv("SSH_TTY");
              if (pcVar5 == (char *)0x0) {
                strcat((char *)&lIn,
                       " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                strcpy(tinyfd_response,"shellementary");
                return (char *)0x1;
              }
              strcpy((char *)&lIn,"shellementary");
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              strcpy(tinyfd_response,"matedialog");
              return (char *)0x1;
            }
            strcpy((char *)&lIn,"matedialog");
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            strcpy(tinyfd_response,"zenity");
            return (char *)0x1;
          }
          strcpy((char *)&lIn,"zenity");
          iVar3 = zenity3Present();
          if ((3 < iVar3) && (pcVar5 = getenv("SSH_TTY"), pcVar5 == (char *)0x0)) {
            strcat((char *)&lIn,
                   " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
          }
        }
        strcat((char *)&lIn," --file-selection --directory");
        if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
          strcat((char *)&lIn," --title=\"");
          strcat((char *)&lIn,aTitle);
          strcat((char *)&lIn,"\"");
        }
        if ((aDefaultPath != (char *)0x0) && (sVar4 = strlen(aDefaultPath), sVar4 != 0)) {
          strcat((char *)&lIn," --filename=\"");
          strcat((char *)&lIn,aDefaultPath);
          strcat((char *)&lIn,"\"");
        }
        if (tinyfd_silent != 0) {
          strcat((char *)&lIn," 2>/dev/null ");
        }
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
        strcpy(tinyfd_response,"kdialog");
        return (char *)0x1;
      }
      strcpy((char *)&lIn,"kdialog");
      iVar3 = kdialogPresent();
      if (iVar3 == 2) {
        strcat((char *)&lIn," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
      }
      strcat((char *)&lIn," --getexistingdirectory ");
      if ((aDefaultPath == (char *)0x0) || (sVar4 = strlen(aDefaultPath), sVar4 == 0)) {
        strcat((char *)&lIn,"$PWD/");
      }
      else {
        if (*aDefaultPath != '/') {
          strcat((char *)&lIn,"$PWD/");
        }
        strcat((char *)&lIn,"\"");
        strcat((char *)&lIn,aDefaultPath);
        strcat((char *)&lIn,"\"");
      }
      if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
        strcat((char *)&lIn," --title \"");
        strcat((char *)&lIn,aTitle);
        strcat((char *)&lIn,"\"");
      }
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
      strcpy(tinyfd_response,"applescript");
      return (char *)0x1;
    }
    strcpy((char *)&lIn,"osascript ");
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      strcat((char *)&lIn," -e \'tell application \"System Events\"\' -e \'Activate\'");
    }
    strcat((char *)&lIn," -e \'try\' -e \'POSIX path of ( choose folder ");
    if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
      strcat((char *)&lIn,"with prompt \"");
      strcat((char *)&lIn,aTitle);
      strcat((char *)&lIn,"\" ");
    }
    if ((aDefaultPath != (char *)0x0) && (sVar4 = strlen(aDefaultPath), sVar4 != 0)) {
      strcat((char *)&lIn,"default location \"");
      strcat((char *)&lIn,aDefaultPath);
      strcat((char *)&lIn,"\" ");
    }
    strcat((char *)&lIn,")\' ");
    strcat((char *)&lIn,"-e \'on error number -128\' ");
    strcat((char *)&lIn,"-e \'end try\'");
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      strcat((char *)&lIn," -e \'end tell\'");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",&lIn);
  }
  __stream = popen((char *)&lIn,"r");
  if (__stream == (FILE *)0x0) {
    aTitle_local = (char *)0x0;
  }
  else {
    do {
      pcVar5 = fgets(tinyfd_selectFolderDialog::lBuff,0x400,__stream);
    } while (pcVar5 != (char *)0x0);
    pclose(__stream);
    sVar4 = strlen(tinyfd_selectFolderDialog::lBuff);
    if (tinyfd_openFileDialog::lBuff[sVar4 + 0x7fff] == '\n') {
      sVar4 = strlen(tinyfd_selectFolderDialog::lBuff);
      tinyfd_openFileDialog::lBuff[sVar4 + 0x7fff] = '\0';
    }
    sVar4 = strlen(tinyfd_selectFolderDialog::lBuff);
    if ((sVar4 == 0) || (iVar3 = dirExists(tinyfd_selectFolderDialog::lBuff), iVar3 == 0)) {
      aTitle_local = (char *)0x0;
    }
    else {
      aTitle_local = tinyfd_selectFolderDialog::lBuff;
    }
  }
  return aTitle_local;
}

Assistant:

char const * tinyfd_selectFolderDialog(
        char const * const aTitle , /* NULL or "" */
        char const * const aDefaultPath ) /* NULL or "" */
{
    static char lBuff [MAX_PATH_OR_CMD] ;
        char const * p ;
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
#ifndef TINYFD_NOSELECTFOLDERWIN
                        p = selectFolderDialogWinGui8(lBuff, aTitle, aDefaultPath);
                }
                else
                {
                        p = selectFolderDialogWinGuiA(lBuff, aTitle, aDefaultPath);
#endif /*TINYFD_NOSELECTFOLDERWIN*/
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = selectFolderDialogWinConsole(lBuff,aTitle,aDefaultPath);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Select folder","");
        }
        
        if ( ! p || ! strlen( p ) || ! dirExists( p ) )
        {
                return NULL ;
        }
        return p ;
}